

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

vec4 __thiscall CEditor::GetButtonColor(CEditor *this,void *pID,int Checked)

{
  void *pvVar1;
  vec4 vVar2;
  vec4 vVar3;
  vec4 vVar4;
  vec4 vVar5;
  
  if (Checked < 0) {
    return (vec4)(ZEXT816(0x3f00000000000000) << 0x40);
  }
  pvVar1 = (this->m_UI).m_pHotItem;
  if (Checked != 0) {
    if (pvVar1 != pID) {
      vVar2.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x0;
      vVar2.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
      vVar2.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
      vVar2.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
      return vVar2;
    }
    vVar4.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x0;
    vVar4.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f400000;
    vVar4.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
    vVar4.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
    return vVar4;
  }
  if (pvVar1 != pID) {
    vVar3.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
    vVar3.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
    vVar3.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
    vVar3.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
    return vVar3;
  }
  vVar5.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
  vVar5.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f400000;
  vVar5.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
  vVar5.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
  return vVar5;
}

Assistant:

vec4 CEditor::GetButtonColor(const void *pID, int Checked)
{
	if(Checked < 0)
		return vec4(0,0,0,0.5f);

	if(Checked > 0)
	{
		if(UI()->HotItem() == pID)
			return vec4(1,0,0,0.75f);
		return vec4(1,0,0,0.5f);
	}

	if(UI()->HotItem() == pID)
		return vec4(1,1,1,0.75f);
	return vec4(1,1,1,0.5f);
}